

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O3

void __thiscall HighsIis::removeRow(HighsIis *this,HighsInt row)

{
  pointer piVar1;
  long lVar2;
  
  piVar1 = (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = ((long)(this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar1) * 0x40000000 + -0x100000000;
  piVar1[row] = *(int *)((long)piVar1 + (lVar2 >> 0x1e));
  std::vector<int,_std::allocator<int>_>::resize(&this->row_index_,lVar2 >> 0x20);
  return;
}

Assistant:

void HighsIis::removeRow(const HighsInt row) {
  HighsInt num_row = this->row_index_.size();
  assert(row < num_row);
  this->row_index_[row] = this->row_index_[num_row - 1];
  this->row_index_.resize(num_row - 1);
}